

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::destroy_thread_for_agent
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  bool bVar1;
  element_type *w;
  undefined1 local_28 [8];
  work_thread_shptr_t thread;
  agent_t *agent_local;
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  *this_local;
  
  thread.
  super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)agent;
  search_and_remove_agent_from_map
            ((dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
              *)local_28,(agent_t *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    w = std::
        __shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_28);
    impl::(anonymous_namespace)::
    shutdown_and_wait<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>
              (w);
  }
  std::
  shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  ::~shared_ptr((shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
                 *)local_28);
  return;
}

Assistant:

void
		destroy_thread_for_agent( const agent_t & agent ) override
			{
				auto thread = search_and_remove_agent_from_map( agent );
				if( thread )
					shutdown_and_wait( *thread );
			}